

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IsPartOf_PDU::IsPartOf_PDU
          (IsPartOf_PDU *this,RelationshipRecord *RR,Vector *LocationOfPart,
          NamedLocationIdentifier *NLI,EntityType *PartType)

{
  EntityType *PartType_local;
  NamedLocationIdentifier *NLI_local;
  Vector *LocationOfPart_local;
  RelationshipRecord *RR_local;
  IsPartOf_PDU *this_local;
  
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IsPartOf_PDU_0032ea18;
  DATA_TYPE::RelationshipRecord::RelationshipRecord(&this->m_RelRec,RR);
  DATA_TYPE::Vector::Vector(&this->m_LocPrt,LocationOfPart);
  DATA_TYPE::NamedLocationIdentifier::NamedLocationIdentifier(&this->m_NmLocID,NLI);
  DATA_TYPE::EntityType::EntityType(&this->m_PrtTyp,PartType);
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\a';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '$';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x34;
  return;
}

Assistant:

IsPartOf_PDU::IsPartOf_PDU( const RelationshipRecord & RR, const Vector & LocationOfPart,
                            const NamedLocationIdentifier & NLI, const EntityType & PartType ) :
    m_RelRec( RR ),
    m_LocPrt( LocationOfPart ),
    m_NmLocID( NLI ),
    m_PrtTyp( PartType )
{
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = EntityManagement;
    m_ui8PDUType = IsPartOf_PDU_Type;
    m_ui16PDULength = IS_PART_OF_PDU_SIZE;
}